

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

void jinit_huff_encoder(j_compress_ptr cinfo)

{
  jpeg_entropy_encoder *pjVar1;
  long lVar2;
  
  pjVar1 = (jpeg_entropy_encoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xf8);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass_huff;
  pjVar1[3].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x0;
  pjVar1[3].finish_pass = (_func_void_j_compress_ptr *)0x0;
  pjVar1[2].finish_pass = (_func_void_j_compress_ptr *)0x0;
  pjVar1[3].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  lVar2 = -4;
  do {
    (&pjVar1[5].encode_mcu)[lVar2] = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x0;
    (&pjVar1[5].encode_mcu + lVar2)[1] = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x0;
    (&pjVar1[8].start_pass)[lVar2] = (_func_void_j_compress_ptr_boolean *)0x0;
    (&pjVar1[8].start_pass + lVar2)[1] = (_func_void_j_compress_ptr_boolean *)0x0;
    (&pjVar1[6].finish_pass)[lVar2] = (_func_void_j_compress_ptr *)0x0;
    (&pjVar1[6].finish_pass + lVar2)[1] = (_func_void_j_compress_ptr *)0x0;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0);
  if (cinfo->progressive_mode != 0) {
    pjVar1[10].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_huff_encoder (j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy;
  int i;

  entropy = (huff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(huff_entropy_encoder));
  cinfo->entropy = (struct jpeg_entropy_encoder *) entropy;
  entropy->pub.start_pass = start_pass_huff;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->dc_derived_tbls[i] = entropy->ac_derived_tbls[i] = NULL;
    entropy->dc_count_ptrs[i] = entropy->ac_count_ptrs[i] = NULL;
  }

  if (cinfo->progressive_mode)
    entropy->bit_buffer = NULL;	/* needed only in AC refinement scan */
}